

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::setVolumeDensity(btSoftBody *this,btScalar density)

{
  long lVar1;
  long lVar2;
  int iVar3;
  float fVar4;
  
  lVar1 = (long)(this->m_tetras).m_size;
  if (lVar1 < 1) {
    fVar4 = 0.0;
  }
  else {
    fVar4 = 0.0;
    lVar2 = 0;
    do {
      iVar3 = 4;
      do {
        fVar4 = fVar4 + ABS((this->m_tetras).m_data[lVar2].m_rv);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != lVar1);
  }
  setVolumeMass(this,(fVar4 * density) / 6.0);
  return;
}

Assistant:

void			btSoftBody::setVolumeDensity(btScalar density)
{
btScalar	volume=0;
for(int i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		volume+=btFabs(t.m_rv);
		}
	}
setVolumeMass(volume*density/6);
}